

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lu_byte luaH_getstr(Table *t,TString *key,TValue *res)

{
  lu_byte lVar1;
  TValue *val;
  
  if (key->shrlen < '\0') {
    val = Hgetlongstr(t,key);
  }
  else {
    val = luaH_Hgetshortstr(t,key);
  }
  lVar1 = finishnodeget(val,res);
  return lVar1;
}

Assistant:

lu_byte luaH_getstr (Table *t, TString *key, TValue *res) {
  return finishnodeget(Hgetstr(t, key), res);
}